

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *this_00;
  cmLinkedTree<cmDefinitions> *this_01;
  pointer pcVar1;
  StackIter end;
  StackIter begin;
  StackIter end_00;
  StackIter begin_00;
  bool bVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  string *psVar5;
  PointerType pcVar6;
  iterator iVar7;
  string_view value;
  string_view value_00;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string binDir;
  PositionType pos;
  iterator it;
  string local_48;
  
  cmPropertyMap::Clear(&this->GlobalProperties);
  it = (iterator)ZEXT816(0);
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  ::operator=((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
               *)this,(_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
                       *)&it);
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
               *)&it);
  cmGlobVerificationManager::Reset
            ((this->GlobVerificationManager)._M_t.
             super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
             .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl);
  pos = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  it = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                 (&this->BuildsystemDirectory);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->IncludeDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->CompileDefinitions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->CompileOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->LinkOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&pBVar3->LinkDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  (pBVar3->CurrentScope).Tree = pos.Tree;
  (pBVar3->CurrentScope).Position = pos.Position;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->NormalTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->ImportedTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  cmPropertyMap::Clear(&pBVar3->Properties);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  pcVar1 = (pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (pBVar3->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
    .super__Vector_impl_data._M_finish = pcVar1;
  }
  this_00 = &this->PolicyStack;
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::Clear(this_00);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->Policies).Tree = this_00;
  (pSVar4->Policies).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->PolicyRoot).Tree = this_00;
  (pSVar4->PolicyRoot).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar4->PolicyScope).Tree = this_00;
  (pSVar4->PolicyScope).Position = 0;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->Policies);
  if (bVar2) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->PolicyRoot);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&binDir,"CMAKE_SOURCE_DIR",(allocator<char> *)&local_c8);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin.Tree = (pSVar4->Vars).Tree;
      begin.Position = (pSVar4->Vars).Position;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end.Tree = (pSVar4->Root).Tree;
      end.Position = (pSVar4->Root).Position;
      psVar5 = (string *)cmDefinitions::Get(&binDir,begin,end);
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&it,(string *)psVar5);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"CMAKE_BINARY_DIR",(allocator<char> *)&local_48);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin_00.Tree = (pSVar4->Vars).Tree;
      begin_00.Position = (pSVar4->Vars).Position;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end_00.Tree = (pSVar4->Root).Tree;
      end_00.Position = (pSVar4->Root).Position;
      psVar5 = (string *)cmDefinitions::Get(&local_c8,begin_00,end_00);
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&binDir,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_c8);
      this_01 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_01);
      iVar7.Position = 0;
      iVar7.Tree = this_01;
      iVar7 = cmLinkedTree<cmDefinitions>::Push(this_01,iVar7);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pSVar4->Vars = iVar7;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar4->Parent).Tree = this_01;
      (pSVar4->Parent).Position = 0;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar4->Root).Tree = this_01;
      (pSVar4->Root).Position = 0;
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"CMAKE_SOURCE_DIR",(allocator<char> *)&local_48);
      value._M_str = (char *)it.Tree;
      value._M_len = it.Position;
      cmDefinitions::Set(pcVar6,&local_c8,value);
      std::__cxx11::string::~string((string *)&local_c8);
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"CMAKE_BINARY_DIR",(allocator<char> *)&local_48);
      value_00._M_str = binDir._M_dataplus._M_p;
      value_00._M_len = binDir._M_string_length;
      cmDefinitions::Set(pcVar6,&local_c8,value_00);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_COMPILE",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,DIRECTORY,&binDir,&local_c8,true,&local_48
                );
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>((string *)&it,"RULE_LAUNCH_LINK",&local_c9)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,DIRECTORY,&binDir,&local_c8,true,&local_48
                );
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_CUSTOM",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,DIRECTORY,&binDir,&local_c8,true,&local_48
                );
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_COMPILE",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,TARGET,&binDir,&local_c8,true,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>((string *)&it,"RULE_LAUNCH_LINK",&local_c9)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,TARGET,&binDir,&local_c8,true,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_CUSTOM",&local_c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&binDir,"",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_cb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_cc);
      cmPropertyDefinitionMap::DefineProperty
                (&this->PropertyDefinitions,(string *)&it,TARGET,&binDir,&local_c8,true,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,pos);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x128,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x127,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.Clear();
  this->PropertyDefinitions = {};
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->CompileDefinitions.clear();
    it->CompileOptions.clear();
    it->LinkOptions.clear();
    it->LinkDirectories.clear();
    it->CurrentScope = pos;
    it->NormalTargetNames.clear();
    it->ImportedTargetNames.clear();
    it->Properties.Clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir);
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir);
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return { this, pos };
}